

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O1

uint8 * __thiscall
google::protobuf::internal::
MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
::InternalSerializeWithCachedSizesToArray
          (MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
           *this,bool deterministic,uint8 *output)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar4;
  ulong uVar5;
  byte *pbVar6;
  
  iVar3 = (*(this->super_MessageLite)._vptr_MessageLite[0x11])();
  uVar4 = *(ulong *)CONCAT44(extraout_var,iVar3);
  *output = '\b';
  pbVar6 = output + 1;
  uVar5 = uVar4;
  if (0x7f < uVar4) {
    do {
      *pbVar6 = (byte)uVar4 | 0x80;
      uVar5 = uVar4 >> 7;
      pbVar6 = pbVar6 + 1;
      bVar2 = 0x3fff < uVar4;
      uVar4 = uVar5;
    } while (bVar2);
  }
  *pbVar6 = (byte)uVar5;
  iVar3 = (*(this->super_MessageLite)._vptr_MessageLite[0x12])(this);
  uVar1 = *(undefined8 *)CONCAT44(extraout_var_00,iVar3);
  pbVar6[1] = 0x11;
  *(undefined8 *)(pbVar6 + 2) = uVar1;
  return pbVar6 + 10;
}

Assistant:

::google::protobuf::uint8* InternalSerializeWithCachedSizesToArray(bool deterministic,
                                                   ::google::protobuf::uint8* output) const {
    output = KeyTypeHandler::InternalWriteToArray(kKeyFieldNumber, key(),
                                                  deterministic, output);
    output = ValueTypeHandler::InternalWriteToArray(kValueFieldNumber, value(),
                                                    deterministic, output);
    return output;
  }